

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall MockParser::MockParser(MockParser *this,char *code)

{
  uint64_t name;
  Message *pMVar1;
  AssertHelper local_158 [3];
  Message local_140;
  Err *local_138;
  Err *err;
  undefined1 local_128 [4];
  int pkg;
  char *local_18;
  char *code_local;
  MockParser *this_local;
  
  local_18 = code;
  code_local = (char *)this;
  vm_new();
  memcpy(this,local_128,0x110);
  this->cur_fn = 0;
  this->cur_ins = 0;
  name = hash_string("test",4);
  err._4_4_ = vm_new_pkg(&this->vm,name);
  local_138 = parse(&this->vm,err._4_4_,(char *)0x0,local_18);
  if (local_138 != (Err *)0x0) {
    testing::Message::Message(&local_140);
    pMVar1 = testing::Message::operator<<(&local_140,&local_138->desc);
    pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [10])" at line ");
    pMVar1 = testing::Message::operator<<(pMVar1,&local_138->line);
    testing::internal::AssertHelper::AssertHelper
              (local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x23,"Failed");
    testing::internal::AssertHelper::operator=(local_158,pMVar1);
    testing::internal::AssertHelper::~AssertHelper(local_158);
    testing::Message::~Message(&local_140);
  }
  return;
}

Assistant:

MockParser(const char *code) {
		vm = vm_new();
		cur_fn = 0;
		cur_ins = 0;

		// Add a package (its main function is created automatically)
		int pkg = vm_new_pkg(&vm, hash_string("test", 4));

		// Parse the source code
		Err *err = parse(&vm, pkg, NULL, (char *) code);
		if (err != NULL) {
			ADD_FAILURE() << err->desc << " at line " << err->line;
		}
	}